

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerReporter
          (RegistryHub *this,string *name,IReporterFactoryPtr *factory)

{
  IReporterFactoryPtr local_10;
  
  local_10 = (IReporterFactoryPtr)factory->m_ptr;
  factory->m_ptr = (IReporterFactory *)0x0;
  ReporterRegistry::registerReporter(&this->m_reporterRegistry,name,&local_10);
  if (local_10.m_ptr != (IReporterFactory *)0x0) {
    (*(local_10.m_ptr)->_vptr_IReporterFactory[1])();
  }
  return;
}

Assistant:

void registerReporter( std::string const& name, IReporterFactoryPtr factory ) override {
                m_reporterRegistry.registerReporter( name, CATCH_MOVE(factory) );
            }